

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closePendingFds(unixFile *pFile)

{
  long lVar1;
  long in_RDI;
  UnixUnusedFd *pNext;
  UnixUnusedFd *p;
  unixInodeInfo *pInode;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  unixFile *local_18;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  local_18 = *(unixFile **)(lVar1 + 0x28);
  while (local_18 != (unixFile *)0x0) {
    local_18 = (unixFile *)local_18->pVfs;
    robust_close(local_18,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    sqlite3_free((void *)0x155299);
  }
  *(undefined8 *)(lVar1 + 0x28) = 0;
  return;
}

Assistant:

static void closePendingFds(unixFile *pFile){
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  assert( unixFileMutexHeld(pFile) );
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    robust_close(pFile, p->fd, __LINE__);
    sqlite3_free(p);
  }
  pInode->pUnused = 0;
}